

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_input(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  int iVar1;
  int local_5c;
  undefined1 local_58 [4];
  int ret;
  st_ptls_record_t rec;
  ptls_handshake_properties_t *properties_local;
  size_t *inlen_local;
  void *input_local;
  ptls_buffer_t *decryptbuf_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  rec.fragment = (uint8_t *)properties;
  iVar1 = parse_record(tls,(st_ptls_record_t *)local_58,(uint8_t *)input,inlen);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (rec.length == 0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                  ,0xce7,
                  "int handle_input(ptls_t *, ptls_buffer_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if (local_58[0] == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if ((rec._0_8_ != 1) || (*(char *)rec.length != '\x01')) {
      return 0x2f;
    }
    local_5c = 0x202;
  }
  else {
    if (((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0) ||
       (local_58[0] == '\x15')) {
      if ((local_58[0] == '\x17') && (((byte)tls->field_0x138 >> 2 & 1) != 0)) {
        local_5c = 0x202;
        goto LAB_0021ff54;
      }
    }
    else {
      if (local_58[0] != '\x17') {
        return 0x28;
      }
      iVar1 = ptls_buffer_reserve(decryptbuf,rec._0_8_ + 5);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,
                           (size_t *)&rec,(void *)rec.length,rec._0_8_);
      if (iVar1 != 0) {
        if (((byte)tls->field_0x138 >> 2 & 1) == 0) {
          return iVar1;
        }
        local_5c = 0x202;
        goto LAB_0021ff54;
      }
      rec.length = (size_t)(decryptbuf->base + decryptbuf->off);
      for (; (rec._0_8_ != 0 && (*(uint8_t *)(rec.length + rec._0_8_ + -1) == '\0'));
          rec._0_8_ = rec._0_8_ + -1) {
      }
      if (rec._0_8_ == 0) {
        return 10;
      }
      local_58[0] = *(uint8_t *)(rec.length + rec._0_8_ + -1);
      rec._0_8_ = rec._0_8_ + -1;
    }
    if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (local_58[0] != '\x16')) {
      if (local_58[0] == '\x15') {
        local_5c = handle_alert(tls,(uint8_t *)rec.length,rec._0_8_);
      }
      else if (local_58[0] == '\x17') {
        if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
          if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
            if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
              decryptbuf->off = rec._0_8_ + decryptbuf->off;
            }
            local_5c = 0;
          }
          else {
            local_5c = 10;
          }
        }
        else {
          decryptbuf->off = rec._0_8_ + decryptbuf->off;
          local_5c = 0;
        }
      }
      else {
        local_5c = 10;
      }
    }
    else {
      local_5c = handle_handshake_record
                           (tls,handle_handshake_message,sendbuf,(st_ptls_record_t *)local_58,
                            (ptls_handshake_properties_t *)rec.fragment);
    }
  }
LAB_0021ff54:
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  return local_5c;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &rec.length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->skip_early_data) {
                ret = PTLS_ERROR_IN_PROGRESS;
                goto NextRecord;
            }
            return ret;
        }
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->skip_early_data) {
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, handle_handshake_message, sendbuf, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;
}